

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::doAddName(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
            *this,string *name)

{
  bool bVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  format *in_stack_ffffffffffffff18;
  NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  NameIndexConcept<avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff48;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  
  concepts::
  NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  size((NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)(in_RDI + 0x20));
  bVar1 = concepts::
          NameIndexConcept<avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                (size_t)in_stack_ffffffffffffff20);
  if (!bVar1) {
    this_00 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (this_00,in_stack_fffffffffffffed8);
    Exception::Exception((Exception *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  concepts::
  NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::add
            (in_stack_ffffffffffffff20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff18);
  return;
}

Assistant:

void doAddName(const std::string &name) { 
        if (! nameIndex_.add(name, leafNameAttributes_.size())) {
            throw Exception(boost::format("Cannot add duplicate name: %1%") % name);
        }
        leafNameAttributes_.add(name);
    }